

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

ShaderExecutor *
vkt::shaderexecutor::createExecutor
          (Context *context,ShaderType shaderType,ShaderSpec *shaderSpec,
          VkDescriptorSetLayout extraResourcesLayout)

{
  InternalError *this;
  ShaderSpec *shaderSpec_local;
  ShaderType shaderType_local;
  Context *context_local;
  VkDescriptorSetLayout extraResourcesLayout_local;
  
  switch(shaderType) {
  case SHADERTYPE_VERTEX:
    extraResourcesLayout_local.m_internal = (deUint64)operator_new(0x138);
    anon_unknown_0::VertexShaderExecutor::VertexShaderExecutor
              ((VertexShaderExecutor *)extraResourcesLayout_local.m_internal,context,shaderSpec,
               extraResourcesLayout);
    break;
  case SHADERTYPE_FRAGMENT:
    extraResourcesLayout_local.m_internal = (deUint64)operator_new(0x138);
    anon_unknown_0::FragmentShaderExecutor::FragmentShaderExecutor
              ((FragmentShaderExecutor *)extraResourcesLayout_local.m_internal,context,shaderSpec,
               extraResourcesLayout);
    break;
  case SHADERTYPE_GEOMETRY:
    extraResourcesLayout_local.m_internal = (deUint64)operator_new(0x138);
    anon_unknown_0::GeometryShaderExecutor::GeometryShaderExecutor
              ((GeometryShaderExecutor *)extraResourcesLayout_local.m_internal,context,shaderSpec,
               extraResourcesLayout);
    break;
  case SHADERTYPE_TESSELLATION_CONTROL:
    extraResourcesLayout_local.m_internal = (deUint64)operator_new(0x118);
    anon_unknown_0::TessControlExecutor::TessControlExecutor
              ((TessControlExecutor *)extraResourcesLayout_local.m_internal,context,shaderSpec,
               extraResourcesLayout);
    break;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    extraResourcesLayout_local.m_internal = (deUint64)operator_new(0x118);
    anon_unknown_0::TessEvaluationExecutor::TessEvaluationExecutor
              ((TessEvaluationExecutor *)extraResourcesLayout_local.m_internal,context,shaderSpec,
               extraResourcesLayout);
    break;
  case SHADERTYPE_COMPUTE:
    extraResourcesLayout_local.m_internal = (deUint64)operator_new(0x118);
    anon_unknown_0::ComputeShaderExecutor::ComputeShaderExecutor
              ((ComputeShaderExecutor *)extraResourcesLayout_local.m_internal,context,shaderSpec,
               extraResourcesLayout);
    break;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,"Unsupported shader type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
               ,0xb3a);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return (ShaderExecutor *)extraResourcesLayout_local.m_internal;
}

Assistant:

ShaderExecutor* createExecutor (Context& context, glu::ShaderType shaderType, const ShaderSpec& shaderSpec, VkDescriptorSetLayout extraResourcesLayout)
{
	switch (shaderType)
	{
		case glu::SHADERTYPE_VERTEX:					return new VertexShaderExecutor		(context, shaderSpec, extraResourcesLayout);
		case glu::SHADERTYPE_TESSELLATION_CONTROL:		return new TessControlExecutor		(context, shaderSpec, extraResourcesLayout);
		case glu::SHADERTYPE_TESSELLATION_EVALUATION:	return new TessEvaluationExecutor	(context, shaderSpec, extraResourcesLayout);
		case glu::SHADERTYPE_GEOMETRY:					return new GeometryShaderExecutor	(context, shaderSpec, extraResourcesLayout);
		case glu::SHADERTYPE_FRAGMENT:					return new FragmentShaderExecutor	(context, shaderSpec, extraResourcesLayout);
		case glu::SHADERTYPE_COMPUTE:					return new ComputeShaderExecutor	(context, shaderSpec, extraResourcesLayout);
		default:
			TCU_THROW(InternalError, "Unsupported shader type");
	}
}